

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O3

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  int *piVar11;
  char **ppcVar12;
  char *pcVar13;
  uint *puVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  uint *puVar15;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char cVar16;
  int iVar17;
  char *__s1;
  char *pcVar18;
  uint uVar19;
  size_t sVar20;
  char *pcVar21;
  char **possible_values;
  char *additional_error_00;
  uint uVar22;
  option *poVar23;
  option *poVar24;
  ulong uVar25;
  char *pcVar26;
  cmdline_parser_arg_type arg_type;
  undefined4 in_stack_fffffffffffffb18;
  uint local_4b4;
  option *local_4a8;
  gengetopt_args_info local_args_info;
  
  package_name = *argv;
  iVar7 = params->override;
  iVar1 = params->check_required;
  uVar25 = (ulong)(uint)params->check_ambiguity;
  pcVar21 = (char *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  cmdline_parser_init(&local_args_info);
  iVar17 = params->print_errors;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 0;
  if (argc < 1) {
    uVar22 = 0;
    pcVar26 = extraout_RDX;
    custom_opterr = iVar17;
LAB_001266e0:
    uVar19 = args_info->sequentialProps_group_counter;
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    if (1 < (int)uVar19) {
      fprintf(_stderr,"%s: %d options of group sequentialProps were given. One is required%s.\n",
              *argv,(ulong)uVar19,"");
      pcVar26 = extraout_RDX_04;
    }
    uVar19 = (uint)(1 < (int)uVar19);
    if (iVar1 != 0) {
      iVar7 = cmdline_parser_required2(args_info,*argv,pcVar26);
      uVar19 = uVar19 + iVar7;
    }
    cmdline_parser_release(&local_args_info);
    iVar7 = 1;
    if (uVar19 == 0) {
      iVar7 = 0;
      uVar19 = argc - uVar22;
      if (uVar19 != 0 && (int)uVar22 <= argc) {
        args_info->inputs_num = uVar19;
        ppcVar12 = (char **)malloc((ulong)uVar19 * 8);
        args_info->inputs = ppcVar12;
        iVar7 = 0;
        uVar25 = 0;
        do {
          pcVar21 = gengetopt_strdup(argv[(long)(int)uVar22 + uVar25]);
          args_info->inputs[uVar25] = pcVar21;
          uVar25 = uVar25 + 1;
        } while (uVar19 != uVar25);
      }
    }
  }
  else {
    additional_error_00 = (char *)0x0;
    pcVar26 = extraout_RDX;
LAB_00125a0c:
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
    iVar4 = (int)additional_error_00;
    custom_opterr = iVar17;
    if ((iVar4 == 0) || ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
      if (iVar4 == 0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        additional_error_00 = (char *)0x1;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = (uint)additional_error_00;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
LAB_00125a74:
      uVar22 = (uint)additional_error_00;
      if ((int)uVar22 < (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = uVar22;
      }
      if ((int)uVar22 < (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar22;
      }
      pcVar26 = (char *)CONCAT71((int7)((ulong)pcVar26 >> 8),
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == uVar22 ||
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7);
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == uVar22 ||
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 != uVar22) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar22;
        }
      }
      else {
        exchange(argv,(custom_getopt_data *)pcVar21);
        additional_error_00 = (char *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar26 = extraout_RDX_00;
      }
      if ((int)additional_error_00 < argc) {
        ppcVar12 = argv + (int)additional_error_00;
        while ((**ppcVar12 != '-' || ((*ppcVar12)[1] == '\0'))) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (int)additional_error_00 + 1;
          additional_error_00 = (char *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          ppcVar12 = ppcVar12 + 1;
          if (argc == _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            piVar11 = (int *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
            goto LAB_001266b7;
          }
        }
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = (uint)additional_error_00;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == argc) {
LAB_001266bc:
        uVar22 = (uint)additional_error_00;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != argc) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          uVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        }
        goto LAB_001266e0;
      }
      lVar8 = (long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
      pcVar18 = argv[lVar8];
      if (*pcVar18 != '-') {
LAB_001269cb:
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
        uVar22 = 1;
        custom_optarg = pcVar18;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar18;
        goto switchD_00125f1e_caseD_64;
      }
      cVar16 = pcVar18[1];
      pcVar26 = (char *)CONCAT71((int7)((ulong)pcVar26 >> 8),cVar16);
      if (cVar16 == '-') {
        if (pcVar18[2] == '\0') {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
          uVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
            exchange(argv,(custom_getopt_data *)pcVar21);
            pcVar26 = extraout_RDX_05;
            uVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar22;
          piVar11 = (int *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
LAB_001266b7:
          *piVar11 = argc;
          additional_error_00 = (char *)(ulong)(uint)argc;
          goto LAB_001266bc;
        }
      }
      else if (cVar16 == '\0') goto LAB_001269cb;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar18 + (ulong)(cVar16 == '-') + 1;
    }
    else {
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
         (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_00125a74;
      lVar8 = (long)iVar4;
    }
    pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    pcVar21 = argv[lVar8];
    if (pcVar21[1] != '-') {
      pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
      cVar16 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      uVar22 = (uint)cVar16;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar21;
      pvVar9 = memchr("hVi:o:b:x:y:z:r:cvt",uVar22,0x14);
      if (pcVar18[1] == '\0') {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (int)additional_error_00 + 1;
        additional_error_00 = (char *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if ((pvVar9 == (void *)0x0) || (cVar16 == ':')) {
        if (iVar17 != 0) {
          fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar22);
        }
        goto LAB_001267a3;
      }
      pcVar26 = (char *)0x0;
      iVar4 = iVar17;
      if (*(char *)((long)pvVar9 + 1) == ':') {
        iVar5 = (int)additional_error_00;
        if (*(char *)((long)pvVar9 + 2) == ':') {
          if (*pcVar21 == '\0') {
            pcVar21 = (char *)0x0;
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar5 + 1;
            additional_error_00 =
                 (char *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
        }
        else {
          if (*pcVar21 == '\0') {
            if (iVar5 != argc) {
              pcVar21 = argv[iVar5];
              goto LAB_00125ed5;
            }
            cVar16 = '?';
            if (iVar17 != 0) {
              fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar22);
              additional_error_00 =
                   (char *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            }
          }
          else {
LAB_00125ed5:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar5 + 1;
            additional_error_00 =
                 (char *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          pcVar26 = (char *)0x0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          uVar22 = (uint)cVar16;
          iVar4 = iVar17;
        }
      }
LAB_00125ee9:
      pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      iVar17 = custom_opterr;
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      if ((int)uVar22 < 0x56) {
        if (uVar22 != 0) {
          if (uVar22 == 0xffffffff) {
            uVar22 = (uint)additional_error_00;
            goto LAB_001266e0;
          }
          if (uVar22 != 0x3f) {
switchD_00125f1e_caseD_64:
            do {
              cmdline_parser_internal();
switchD_00125f1e_default:
            } while (uVar22 != 0x56);
            cmdline_parser_print_version();
LAB_00126a03:
            cmdline_parser_free(&local_args_info);
            exit(0);
          }
          goto LAB_001267b1;
        }
LAB_00125f65:
        pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        pcVar26 = cmdline_parser_internal::long_options[(int)pcVar26].name;
        iVar5 = 0x20530b;
        custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        iVar17 = custom_opterr;
        iVar4 = strcmp(pcVar26,"sele1");
        puVar14 = &local_args_info.sele1_given;
        puVar15 = &args_info->sele1_given;
        pcVar21 = (char *)&args_info->sele1_orig;
        ppcVar12 = &args_info->sele1_arg;
        if (iVar4 == 0) {
LAB_001263e4:
          iVar4 = update_arg(ppcVar12,(char **)pcVar21,puVar15,puVar14,pcVar18,(char **)0x0,
                             (char *)0x0,ARG_STRING,(int)uVar25,iVar7,iVar5,0x2d,
                             (char *)CONCAT44(iVar17,in_stack_fffffffffffffb18),(char)uVar25,
                             additional_error_00);
          pcVar26 = extraout_RDX_03;
          if (iVar4 == 0) goto LAB_0012639e;
          goto LAB_001267b1;
        }
        iVar5 = 0x205311;
        iVar4 = strcmp(pcVar26,"sele2");
        puVar14 = &local_args_info.sele2_given;
        puVar15 = &args_info->sele2_given;
        pcVar21 = (char *)&args_info->sele2_orig;
        ppcVar12 = &args_info->sele2_arg;
        if (iVar4 == 0) goto LAB_001263e4;
        iVar5 = strcmp(pcVar26,"nbins_z");
        iVar4 = iVar17;
        if (iVar5 == 0) {
          iVar6 = 0x2d;
          iVar5 = 0x20531d;
          puVar14 = &local_args_info.nbins_z_given;
          puVar15 = &args_info->nbins_z_given;
          pcVar21 = (char *)&args_info->nbins_z_orig;
          ppcVar12 = (char **)&args_info->nbins_z_arg;
          goto LAB_0012643f;
        }
        iVar5 = strcmp(pcVar26,"privilegedAxis");
        if (iVar5 == 0) {
          possible_values = cmdline_parser_privilegedAxis_values;
          iVar6 = 0x2d;
          iVar5 = 0x205325;
          arg_type = ARG_ENUM;
          pcVar26 = "z";
          puVar14 = &local_args_info.privilegedAxis_given;
          puVar15 = &args_info->privilegedAxis_given;
          pcVar21 = (char *)&args_info->privilegedAxis_orig;
          ppcVar12 = (char **)&args_info->privilegedAxis_arg;
          goto LAB_0012638d;
        }
        iVar5 = 0x20535c;
        iVar6 = strcmp(pcVar26,"threshDens");
        puVar14 = &local_args_info.threshDens_given;
        puVar15 = &args_info->threshDens_given;
        pcVar21 = (char *)&args_info->threshDens_orig;
        ppcVar12 = (char **)&args_info->threshDens_arg;
        if (iVar6 == 0) {
LAB_0012651d:
          iVar6 = 0x2d;
          goto LAB_00126383;
        }
        iVar5 = 0x205367;
        iVar6 = strcmp(pcVar26,"bufferLength");
        puVar14 = &local_args_info.bufferLength_given;
        puVar15 = &args_info->bufferLength_given;
        pcVar21 = (char *)&args_info->bufferLength_orig;
        ppcVar12 = (char **)&args_info->bufferLength_arg;
        if (iVar6 == 0) goto LAB_0012651d;
        iVar5 = 0x205374;
        iVar6 = strcmp(pcVar26,"rcut");
        puVar14 = &local_args_info.rcut_given;
        puVar15 = &args_info->rcut_given;
        pcVar21 = (char *)&args_info->rcut_orig;
        ppcVar12 = (char **)&args_info->rcut_arg;
        if (iVar6 == 0) goto LAB_0012651d;
        iVar5 = strcmp(pcVar26,"deltaCount");
        if (iVar5 == 0) {
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 0x2d;
          iVar5 = 0x205380;
          puVar14 = &local_args_info.deltaCount_given;
          puVar15 = &args_info->deltaCount_given;
          goto LAB_001262da;
        }
        iVar5 = strcmp(pcVar26,"fluxOut");
        if (iVar5 == 0) {
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 0x2d;
          iVar5 = 0x20459c;
          puVar14 = &local_args_info.fluxOut_given;
          puVar15 = &args_info->fluxOut_given;
          goto LAB_001262da;
        }
        iVar5 = strcmp(pcVar26,"ca1");
        if (iVar5 == 0) {
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 0x2d;
          iVar5 = 0x204391;
          puVar14 = &local_args_info.ca1_given;
          puVar15 = &args_info->ca1_given;
          goto LAB_001262da;
        }
        iVar5 = strcmp(pcVar26,"ca2");
        if (iVar5 == 0) {
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 0x2d;
          iVar5 = 0x204509;
          puVar14 = &local_args_info.ca2_given;
          puVar15 = &args_info->ca2_given;
          goto LAB_001262da;
        }
        pcVar21 = "gcn";
        iVar5 = strcmp(pcVar26,"gcn");
        pcVar26 = extraout_RDX_01;
        if (iVar5 == 0) {
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 0x2d;
          iVar5 = 0x20538b;
          puVar14 = &local_args_info.gcn_given;
          puVar15 = &args_info->gcn_given;
          goto LAB_001262da;
        }
      }
      else {
        switch(uVar22) {
        case 0x62:
          iVar6 = 0x62;
          iVar5 = 0x205317;
          puVar14 = &local_args_info.nbins_given;
          puVar15 = &args_info->nbins_given;
          pcVar21 = (char *)&args_info->nbins_orig;
          ppcVar12 = (char **)&args_info->nbins_arg;
LAB_0012643f:
          possible_values = (char **)0x0;
          arg_type = ARG_INT;
          pcVar26 = "100";
          goto LAB_0012638d;
        case 99:
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 99;
          iVar5 = 0x204029;
          puVar14 = &local_args_info.com_given;
          puVar15 = &args_info->com_given;
          goto LAB_001262da;
        case 100:
        case 0x65:
        case 0x66:
        case 0x67:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x75:
        case 0x77:
          goto switchD_00125f1e_caseD_64;
        case 0x68:
          cmdline_parser_print_help();
          goto LAB_00126a03;
        case 0x69:
          iVar6 = 0x69;
          iVar5 = 0x2052fe;
          puVar14 = &local_args_info.input_given;
          puVar15 = &args_info->input_given;
          pcVar21 = (char *)&args_info->input_orig;
          ppcVar12 = &args_info->input_arg;
          goto LAB_00126317;
        case 0x6f:
          iVar6 = 0x6f;
          iVar5 = 0x205304;
          puVar14 = &local_args_info.output_given;
          puVar15 = &args_info->output_given;
          pcVar21 = (char *)&args_info->output_orig;
          ppcVar12 = &args_info->output_arg;
LAB_00126317:
          arg_type = ARG_STRING;
          goto LAB_0012638b;
        case 0x72:
          iVar6 = 0x72;
          iVar5 = 0x205353;
          puVar14 = &local_args_info.dropletR_given;
          puVar15 = &args_info->dropletR_given;
          pcVar21 = (char *)&args_info->dropletR_orig;
          ppcVar12 = (char **)&args_info->dropletR_arg;
          break;
        case 0x74:
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 0x74;
          iVar5 = 0x20538f;
          puVar14 = &local_args_info.testequi_given;
          puVar15 = &args_info->testequi_given;
          goto LAB_001262da;
        case 0x76:
          iVar5 = args_info->sequentialProps_group_counter;
          if (iVar5 != 0 && iVar7 != 0) {
            args_info->ca1_given = 0;
            args_info->ca2_given = 0;
            args_info->gcn_given = 0;
            args_info->testequi_given = 0;
            args_info->com_given = 0;
            args_info->comvel_given = 0;
            args_info->deltaCount_given = 0;
            args_info->fluxOut_given = 0;
            iVar5 = 0;
          }
          args_info->sequentialProps_group_counter = iVar5 + 1;
          iVar6 = 0x76;
          iVar5 = 0x205379;
          puVar14 = &local_args_info.comvel_given;
          puVar15 = &args_info->comvel_given;
LAB_001262da:
          ppcVar12 = (char **)0x0;
          pcVar21 = (char *)0x0;
          arg_type = ARG_NO;
          goto LAB_0012638b;
        case 0x78:
          iVar6 = 0x78;
          iVar5 = 0x205334;
          puVar14 = &local_args_info.centroidX_given;
          puVar15 = &args_info->centroidX_given;
          pcVar21 = (char *)&args_info->centroidX_orig;
          ppcVar12 = (char **)&args_info->centroidX_arg;
          break;
        case 0x79:
          iVar6 = 0x79;
          iVar5 = 0x20533e;
          puVar14 = &local_args_info.centroidY_given;
          puVar15 = &args_info->centroidY_given;
          pcVar21 = (char *)&args_info->centroidY_orig;
          ppcVar12 = (char **)&args_info->centroidY_arg;
          break;
        case 0x7a:
          iVar6 = 0x7a;
          iVar5 = 0x205348;
          puVar14 = &local_args_info.referenceZ_given;
          puVar15 = &args_info->referenceZ_given;
          pcVar21 = (char *)&args_info->referenceZ_orig;
          ppcVar12 = (char **)&args_info->referenceZ_arg;
          break;
        default:
          goto switchD_00125f1e_default;
        }
LAB_00126383:
        arg_type = ARG_DOUBLE;
LAB_0012638b:
        possible_values = (char **)0x0;
        pcVar26 = (char *)0x0;
LAB_0012638d:
        iVar4 = update_arg(ppcVar12,(char **)pcVar21,puVar15,puVar14,pcVar18,possible_values,pcVar26
                           ,arg_type,(int)uVar25,iVar7,iVar5,iVar6,
                           (char *)CONCAT44(iVar4,in_stack_fffffffffffffb18),(char)uVar25,
                           additional_error_00);
        pcVar26 = extraout_RDX_02;
        if (iVar4 != 0) goto LAB_001267b1;
      }
LAB_0012639e:
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (uint)additional_error_00;
      custom_optarg = pcVar18;
      goto LAB_00125a0c;
    }
    for (sVar20 = 0;
        (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar20] != '\0' &&
        (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar20] != '=')); sVar20 = sVar20 + 1)
    {
    }
    local_4b4 = 0xffffffff;
    pcVar26 = (char *)0x0;
    __s1 = "help";
    bVar2 = false;
    local_4a8 = (option *)0x0;
    poVar23 = cmdline_parser_internal::long_options;
    poVar24 = poVar23;
    bVar3 = bVar2;
    pcVar13 = pcVar26;
    do {
      while( true ) {
        uVar22 = (uint)pcVar26;
        iVar4 = strncmp(__s1,pcVar18,sVar20);
        if (iVar4 != 0) break;
        poVar23 = poVar23 + 1;
        do {
          sVar10 = strlen(__s1);
          uVar19 = (uint)additional_error_00;
          uVar22 = (uint)pcVar26;
          if ((int)sVar10 == (int)sVar20) {
            local_4a8 = poVar23 + -1;
            goto LAB_00125d5c;
          }
          if (local_4a8 == (option *)0x0) {
            local_4b4 = (uint)pcVar13;
            local_4a8 = poVar24;
            poVar23 = poVar24;
            uVar22 = local_4b4;
            bVar2 = bVar3;
            goto LAB_00125d12;
          }
          if (((local_4a8->has_arg == poVar23[-1].has_arg) && (local_4a8->flag == poVar23[-1].flag))
             && (local_4a8->val == poVar23[-1].val)) {
            poVar23 = poVar23 + -1;
            goto LAB_00125d12;
          }
          __s1 = poVar23->name;
          if (__s1 == (char *)0x0) goto LAB_00126776;
          pcVar26 = (char *)(ulong)(uVar22 + 1);
          iVar4 = strncmp(__s1,pcVar18,sVar20);
          uVar19 = (uint)additional_error_00;
          poVar23 = poVar23 + 1;
          bVar2 = true;
        } while (iVar4 == 0);
        pcVar26 = (char *)(ulong)(uVar22 + 2);
        __s1 = poVar23->name;
        if (__s1 == (char *)0x0) goto LAB_00126776;
      }
LAB_00125d12:
      uVar19 = (uint)additional_error_00;
      __s1 = poVar23[1].name;
      poVar23 = poVar23 + 1;
      pcVar26 = (char *)(ulong)(uVar22 + 1);
      poVar24 = poVar23;
      bVar3 = bVar2;
      pcVar13 = pcVar26;
    } while (__s1 != (char *)0x0);
    if (bVar2) {
LAB_00126776:
      if (iVar17 != 0) {
        fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar21);
        pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
        uVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      sVar20 = strlen(pcVar18);
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar18 + sVar20;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar19 + 1;
    }
    else {
      pcVar26 = (char *)(ulong)local_4b4;
      if (local_4a8 != (option *)0x0) {
LAB_00125d5c:
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar19 + 1;
        if (pcVar18[sVar20] == '\0') {
          if (local_4a8->has_arg == 1) {
            if (argc <= (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              if (iVar17 != 0) {
                fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar21);
                pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
              goto LAB_001268e9;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                 argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar19 + 2;
          }
        }
        else {
          if (local_4a8->has_arg == 0) {
            pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            if (iVar17 != 0) {
              if (pcVar21[1] == '-') {
                fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                        local_4a8->name);
                pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
              else {
                fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                        (ulong)(uint)(int)*pcVar21,local_4a8->name);
                pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
            }
LAB_001268e9:
            sVar20 = strlen(pcVar18);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar18 + sVar20;
            goto LAB_001267a3;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar18 + sVar20 + 1;
        }
        uVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        sVar20 = strlen(pcVar18);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar18 + sVar20;
        uVar22 = local_4a8->val;
        if ((uint *)local_4a8->flag == (uint *)0x0) {
          additional_error_00 = (char *)(ulong)uVar19;
          iVar4 = iVar17;
          goto LAB_00125ee9;
        }
        *local_4a8->flag = uVar22;
        additional_error_00 = (char *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        goto LAB_00125f65;
      }
      if (iVar17 != 0) {
        fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar18);
        uVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar19 + 1;
    }
LAB_001267a3:
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
LAB_001267b1:
    cmdline_parser_release(&local_args_info);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "output",	1, NULL, 'o' },
        { "sele1",	1, NULL, 0 },
        { "sele2",	1, NULL, 0 },
        { "nbins",	1, NULL, 'b' },
        { "nbins_z",	1, NULL, 0 },
        { "privilegedAxis",	1, NULL, 0 },
        { "centroidX",	1, NULL, 'x' },
        { "centroidY",	1, NULL, 'y' },
        { "referenceZ",	1, NULL, 'z' },
        { "dropletR",	1, NULL, 'r' },
        { "threshDens",	1, NULL, 0 },
        { "bufferLength",	1, NULL, 0 },
        { "rcut",	1, NULL, 0 },
        { "com",	0, NULL, 'c' },
        { "comvel",	0, NULL, 'v' },
        { "deltaCount",	0, NULL, 0 },
        { "fluxOut",	0, NULL, 0 },
        { "ca1",	0, NULL, 0 },
        { "ca2",	0, NULL, 0 },
        { "gcn",	0, NULL, 0 },
        { "testequi",	0, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:o:b:x:y:z:r:cvt", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input dump file.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* number of bins (general purpose).  */
        
        
          if (update_arg( (void *)&(args_info->nbins_arg), 
               &(args_info->nbins_orig), &(args_info->nbins_given),
              &(local_args_info.nbins_given), optarg, 0, "100", ARG_INT,
              check_ambiguity, override, 0, 0,
              "nbins", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* Location of droplet centroid in x.  */
        
        
          if (update_arg( (void *)&(args_info->centroidX_arg), 
               &(args_info->centroidX_orig), &(args_info->centroidX_given),
              &(local_args_info.centroidX_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidX", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'y':	/* Location of droplet centroid in y.  */
        
        
          if (update_arg( (void *)&(args_info->centroidY_arg), 
               &(args_info->centroidY_orig), &(args_info->centroidY_given),
              &(local_args_info.centroidY_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidY", 'y',
              additional_error))
            goto failure;
        
          break;
        case 'z':	/* Reference z-height of solid surface.  */
        
        
          if (update_arg( (void *)&(args_info->referenceZ_arg), 
               &(args_info->referenceZ_orig), &(args_info->referenceZ_given),
              &(local_args_info.referenceZ_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "referenceZ", 'z',
              additional_error))
            goto failure;
        
          break;
        case 'r':	/* Droplet radius in angstroms.  */
        
        
          if (update_arg( (void *)&(args_info->dropletR_arg), 
               &(args_info->dropletR_orig), &(args_info->dropletR_given),
              &(local_args_info.dropletR_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "dropletR", 'r',
              additional_error))
            goto failure;
        
          break;
        case 'c':	/* selection center of mass.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->com_given),
              &(local_args_info.com_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "com", 'c',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* selection center of mass velocity.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->comvel_given),
              &(local_args_info.comvel_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "comvel", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* Temperature using all componets of linear and angular momentum.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->testequi_given),
              &(local_args_info.testequi_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "testequi", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* select first stuntdouble set.  */
          if (strcmp (long_options[option_index].name, "sele1") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele1_arg), 
                 &(args_info->sele1_orig), &(args_info->sele1_given),
                &(local_args_info.sele1_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele1", '-',
                additional_error))
              goto failure;
          
          }
          /* select second stuntdouble set (if sele2 is not set, use script from sele1).  */
          else if (strcmp (long_options[option_index].name, "sele2") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele2_arg), 
                 &(args_info->sele2_orig), &(args_info->sele2_given),
                &(local_args_info.sele2_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele2", '-',
                additional_error))
              goto failure;
          
          }
          /* number of bins in z axis.  */
          else if (strcmp (long_options[option_index].name, "nbins_z") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nbins_z_arg), 
                 &(args_info->nbins_z_orig), &(args_info->nbins_z_given),
                &(local_args_info.nbins_z_given), optarg, 0, "100", ARG_INT,
                check_ambiguity, override, 0, 0,
                "nbins_z", '-',
                additional_error))
              goto failure;
          
          }
          /* which axis is special for spatial analysis (default = z axis).  */
          else if (strcmp (long_options[option_index].name, "privilegedAxis") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->privilegedAxis_arg), 
                 &(args_info->privilegedAxis_orig), &(args_info->privilegedAxis_given),
                &(local_args_info.privilegedAxis_given), optarg, cmdline_parser_privilegedAxis_values, "z", ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "privilegedAxis", '-',
                additional_error))
              goto failure;
          
          }
          /* Threshold Density in g/cm^3.  */
          else if (strcmp (long_options[option_index].name, "threshDens") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->threshDens_arg), 
                 &(args_info->threshDens_orig), &(args_info->threshDens_given),
                &(local_args_info.threshDens_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "threshDens", '-',
                additional_error))
              goto failure;
          
          }
          /* Buffer length in angstroms.  */
          else if (strcmp (long_options[option_index].name, "bufferLength") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->bufferLength_arg), 
                 &(args_info->bufferLength_orig), &(args_info->bufferLength_given),
                &(local_args_info.bufferLength_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "bufferLength", '-',
                additional_error))
              goto failure;
          
          }
          /* cutoff radius (rcut).  */
          else if (strcmp (long_options[option_index].name, "rcut") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->rcut_arg), 
                 &(args_info->rcut_orig), &(args_info->rcut_given),
                &(local_args_info.rcut_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "rcut", '-',
                additional_error))
              goto failure;
          
          }
          /* difference in counts between two selections.  */
          else if (strcmp (long_options[option_index].name, "deltaCount") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->deltaCount_given),
                &(local_args_info.deltaCount_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "deltaCount", '-',
                additional_error))
              goto failure;
          
          }
          /* number flux out of a selection.  */
          else if (strcmp (long_options[option_index].name, "fluxOut") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->fluxOut_given),
                &(local_args_info.fluxOut_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "fluxOut", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using center of mass).  */
          else if (strcmp (long_options[option_index].name, "ca1") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca1_given),
                &(local_args_info.ca1_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca1", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using density profile).  */
          else if (strcmp (long_options[option_index].name, "ca2") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca2_given),
                &(local_args_info.ca2_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca2", '-',
                additional_error))
              goto failure;
          
          }
          /* Generalized Coordinate Number.  */
          else if (strcmp (long_options[option_index].name, "gcn") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->gcn_given),
                &(local_args_info.gcn_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "gcn", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->sequentialProps_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group sequentialProps were given. One is required%s.\n", argv[0], args_info->sequentialProps_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}